

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O0

Aig_Obj_t * Aig_ManFetchMemory(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *__s;
  Aig_Obj_t *pTemp;
  Aig_Man_t *p_local;
  
  __s = (Aig_Obj_t *)Aig_MmFixedEntryFetch(p->pMemObjs);
  memset(__s,0,0x30);
  iVar1 = Vec_PtrSize(p->vObjs);
  __s->Id = iVar1;
  Vec_PtrPush(p->vObjs,__s);
  return __s;
}

Assistant:

static inline Aig_Obj_t * Aig_ManFetchMemory( Aig_Man_t * p )  
{
    extern char * Aig_MmFixedEntryFetch( Aig_MmFixed_t * p );
    Aig_Obj_t * pTemp;
    pTemp = (Aig_Obj_t *)Aig_MmFixedEntryFetch( p->pMemObjs );
    memset( pTemp, 0, sizeof(Aig_Obj_t) ); 
    pTemp->Id = Vec_PtrSize(p->vObjs);
    Vec_PtrPush( p->vObjs, pTemp );
    return pTemp;
}